

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_iterator.hpp
# Opt level: O3

void __thiscall
boost::iterators::
filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::satisfy_predicate(filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *this)

{
  _Base_ptr p_Var1;
  
  p_Var1 = (this->super_type).m_iterator.iter_._M_node;
  while ((p_Var1 != (this->m_end).iter_._M_node &&
         ((element_type *)(this->m_predicate).self_ == (this->super_type).m_iterator.cur_.px))) {
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    (this->super_type).m_iterator.iter_._M_node = p_Var1;
    xpressive::detail::
    weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::satisfy_((weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this);
    p_Var1 = (this->super_type).m_iterator.iter_._M_node;
  }
  return;
}

Assistant:

void satisfy_predicate()
      {
          while (this->base() != this->m_end && !this->m_predicate(*this->base()))
              ++(this->base_reference());
      }